

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::SetUseUtf8StringEscaping(Printer *this,bool as_utf8)

{
  FastFieldValuePrinter *pFVar1;
  FastFieldValuePrinter *this_00;
  undefined3 in_register_00000031;
  
  this_00 = (FastFieldValuePrinter *)operator_new(8);
  if (CONCAT31(in_register_00000031,as_utf8) == 0) {
    FastFieldValuePrinter::FastFieldValuePrinter(this_00);
  }
  else {
    this_00->_vptr_FastFieldValuePrinter = (_func_int **)&PTR__FastFieldValuePrinter_003e3370;
  }
  pFVar1 = (this->default_field_value_printer_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
           .
           super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
           ._M_head_impl;
  (this->default_field_value_printer_)._M_t.
  super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
  _M_head_impl = this_00;
  if (pFVar1 != (FastFieldValuePrinter *)0x0) {
    (*pFVar1->_vptr_FastFieldValuePrinter[1])();
    return;
  }
  return;
}

Assistant:

void TextFormat::Printer::SetUseUtf8StringEscaping(bool as_utf8) {
  SetDefaultFieldValuePrinter(as_utf8 ? new FastFieldValuePrinterUtf8Escaping()
                                      : new FastFieldValuePrinter());
}